

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O2

void release_obmc_buffers(OBMCBuffer *obmc_buffer)

{
  aom_free(obmc_buffer->mask);
  aom_free(obmc_buffer->above_pred);
  aom_free(obmc_buffer->left_pred);
  aom_free(obmc_buffer->wsrc);
  obmc_buffer->above_pred = (uint8_t *)0x0;
  obmc_buffer->left_pred = (uint8_t *)0x0;
  obmc_buffer->wsrc = (int32_t *)0x0;
  obmc_buffer->mask = (int32_t *)0x0;
  return;
}

Assistant:

static inline void release_obmc_buffers(OBMCBuffer *obmc_buffer) {
  aom_free(obmc_buffer->mask);
  aom_free(obmc_buffer->above_pred);
  aom_free(obmc_buffer->left_pred);
  aom_free(obmc_buffer->wsrc);

  obmc_buffer->mask = NULL;
  obmc_buffer->above_pred = NULL;
  obmc_buffer->left_pred = NULL;
  obmc_buffer->wsrc = NULL;
}